

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O0

void paniclog(char *type,char *reason)

{
  FILE *__stream;
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  char local_128 [8];
  char buf [256];
  FILE *lfile;
  char *reason_local;
  char *type_local;
  
  if (program_state.in_paniclog == 0) {
    program_state.in_paniclog = 1;
    __stream = (FILE *)fopen_datafile("paniclog","a",4);
    if (__stream != (FILE *)0x0) {
      pcVar1 = version_string(local_128);
      lVar2 = yyyymmdd(0);
      pcVar3 = "(none)";
      if (plname[0] != '\0') {
        pcVar3 = plname;
      }
      fprintf(__stream,"%s %08ld, %ld %s: %s %s\n",pcVar1,lVar2,u.ubirthday,pcVar3,type,reason);
      fclose(__stream);
    }
    program_state.in_paniclog = 0;
  }
  return;
}

Assistant:

void paniclog(const char *type,   /* panic, impossible, trickery */
	      const char *reason) /* explanation */
{
#ifdef PANICLOG
	FILE *lfile;
	char buf[BUFSZ];

	if (!program_state.in_paniclog) {
		program_state.in_paniclog = 1;
		lfile = fopen_datafile(PANICLOG, "a", TROUBLEPREFIX);
		if (lfile) {
		    fprintf(lfile, "%s %08ld, %ld %s: %s %s\n",
				   version_string(buf), yyyymmdd((time_t)0L),
				   u.ubirthday, (plname[0] ? plname : "(none)"),
				   type, reason);
		    fclose(lfile);
		}
		program_state.in_paniclog = 0;
	}
#endif /* PANICLOG */
	return;
}